

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

Gia_RsbMan_t *
Gia_RsbAlloc(Gia_Man_t *pGia,word *pOffSet,word *pOnSet,Vec_Wrd_t *vSims,int nWords,
            Vec_Wrd_t *vSimsT,int nWordsT,Vec_Int_t *vCands)

{
  int iVar1;
  int iVar2;
  Gia_RsbMan_t *pGVar3;
  Vec_Int_t *pVVar4;
  Vec_Wec_t *pVVar5;
  word *pwVar6;
  int Value1;
  int Value0;
  Gia_RsbMan_t *p;
  int iObj;
  int i;
  Vec_Wrd_t *vSimsT_local;
  int nWords_local;
  Vec_Wrd_t *vSims_local;
  word *pOnSet_local;
  word *pOffSet_local;
  Gia_Man_t *pGia_local;
  
  pGVar3 = (Gia_RsbMan_t *)calloc(1,0x78);
  if (0x400 < nWords) {
    __assert_fail("nWords <= 1024",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x563,
                  "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                 );
  }
  iVar1 = Vec_WrdSize(vSims);
  if (iVar1 != nWords * 0x40 * nWordsT) {
    __assert_fail("Vec_WrdSize(vSims) == 64 * nWords * nWordsT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x564,
                  "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                 );
  }
  iVar1 = Vec_WrdSize(vSims);
  iVar2 = Vec_WrdSize(vSimsT);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_WrdSize(vSims) == Vec_WrdSize(vSimsT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x565,
                  "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                 );
  }
  pGVar3->pGia = pGia;
  pGVar3->pOffSet = pOffSet;
  pGVar3->pOnSet = pOnSet;
  pGVar3->nWords = nWords;
  pGVar3->nWordsT = nWordsT;
  pGVar3->vSims = vSims;
  pGVar3->vSimsT = vSimsT;
  pGVar3->vCands = vCands;
  pVVar4 = Vec_IntAlloc(100);
  pGVar3->vObjs = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  pGVar3->vObjs2 = pVVar4;
  pVVar5 = Vec_WecAlloc(0x400);
  pGVar3->vSets[0] = pVVar5;
  pVVar5 = Vec_WecAlloc(0x400);
  pGVar3->vSets[1] = pVVar5;
  pwVar6 = (word *)calloc((long)nWordsT,8);
  pGVar3->pSet[0] = pwVar6;
  pwVar6 = (word *)calloc((long)nWordsT,8);
  pGVar3->pSet[1] = pwVar6;
  pwVar6 = (word *)calloc((long)nWordsT,8);
  pGVar3->pSet[2] = pwVar6;
  pVVar4 = Vec_IntAlloc(100);
  pGVar3->vActive = pVVar4;
  for (p._4_4_ = 0; iVar1 = Vec_IntSize(vCands), p._4_4_ < iVar1; p._4_4_ = p._4_4_ + 1) {
    iVar1 = Vec_IntEntry(vCands,p._4_4_);
    if (nWordsT * 0x40 <= iVar1) {
      __assert_fail("iObj < nWordsT * 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                    ,0x578,
                    "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                   );
    }
    Abc_TtSetBit(pGVar3->pSet[0],iVar1);
  }
  Vec_WecPushLevel(pGVar3->vSets[0]);
  Vec_WecPushLevel(pGVar3->vSets[1]);
  for (p._4_4_ = 0; p._4_4_ < nWords * 0x40; p._4_4_ = p._4_4_ + 1) {
    iVar1 = Abc_TtGetBit(pOffSet,p._4_4_);
    iVar2 = Abc_TtGetBit(pOnSet,p._4_4_);
    if ((iVar1 == 0) || (iVar2 != 0)) {
      if ((iVar1 == 0) && (iVar2 != 0)) {
        Vec_WecPush(pGVar3->vSets[1],0,p._4_4_);
      }
      else if ((iVar1 != 0) && (iVar2 != 0)) {
        __assert_fail("!Value0 || !Value1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                      ,0x585,
                      "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                     );
      }
    }
    else {
      Vec_WecPush(pGVar3->vSets[0],0,p._4_4_);
    }
  }
  iVar1 = Vec_WecSize(pGVar3->vSets[0]);
  if (iVar1 != 1) {
    __assert_fail("Vec_WecSize(p->vSets[0]) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x587,
                  "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
                 );
  }
  iVar1 = Vec_WecSize(pGVar3->vSets[1]);
  if (iVar1 == 1) {
    Abc_Random(1);
    return pGVar3;
  }
  __assert_fail("Vec_WecSize(p->vSets[1]) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                ,0x588,
                "Gia_RsbMan_t *Gia_RsbAlloc(Gia_Man_t *, word *, word *, Vec_Wrd_t *, int, Vec_Wrd_t *, int, Vec_Int_t *)"
               );
}

Assistant:

Gia_RsbMan_t * Gia_RsbAlloc( Gia_Man_t * pGia, word * pOffSet, word * pOnSet, Vec_Wrd_t * vSims, int nWords, Vec_Wrd_t * vSimsT, int nWordsT, Vec_Int_t * vCands )
{
    int i, iObj;
    Gia_RsbMan_t * p = ABC_CALLOC( Gia_RsbMan_t, 1 );
    assert( nWords <= 1024 );
    assert( Vec_WrdSize(vSims) == 64 * nWords * nWordsT );
    assert( Vec_WrdSize(vSims) == Vec_WrdSize(vSimsT) );
    p->pGia      = pGia;
    p->pOffSet   = pOffSet;
    p->pOnSet    = pOnSet;
    p->nWords    = nWords;
    p->nWordsT   = nWordsT;
    p->vSims     = vSims;
    p->vSimsT    = vSimsT;
    p->vCands    = vCands;
    p->vObjs     = Vec_IntAlloc( 100 );
    p->vObjs2    = Vec_IntAlloc( 100 );
    p->vSets[0]  = Vec_WecAlloc( 1024 );
    p->vSets[1]  = Vec_WecAlloc( 1024 );
    p->pSet[0]   = ABC_CALLOC( word, nWordsT );
    p->pSet[1]   = ABC_CALLOC( word, nWordsT );
    p->pSet[2]   = ABC_CALLOC( word, nWordsT );
    p->vActive   = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vCands, iObj, i )
    {
        assert( iObj < nWordsT * 64 );
        Abc_TtSetBit( p->pSet[0], iObj );
    }
    Vec_WecPushLevel( p->vSets[0] );
    Vec_WecPushLevel( p->vSets[1] );
    for ( i = 0; i < 64*nWords; i++ )
    {
        int Value0 = Abc_TtGetBit( pOffSet, i );
        int Value1 = Abc_TtGetBit( pOnSet,  i );
        if ( Value0 && !Value1 )
            Vec_WecPush( p->vSets[0], 0, i );
        else if ( !Value0 && Value1 )
            Vec_WecPush( p->vSets[1], 0, i );
        else assert( !Value0 || !Value1 );
    }
    assert( Vec_WecSize(p->vSets[0]) == 1 );
    assert( Vec_WecSize(p->vSets[1]) == 1 );
    Abc_Random( 1 );
    //Extra_PrintBinary2( stdout, (unsigned*)pOffSet, 64*nWords ); printf( "\n" );
    //Extra_PrintBinary2( stdout, (unsigned*)pOnSet,  64*nWords ); printf( "\n" );
    return p;
}